

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mum.cc
# Opt level: O3

void mum_hash_test(void *key,int len,uint32_t seed,void *out)

{
  ulong uVar1;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  uint64_t *puVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar49 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ulong uVar2;
  undefined1 auVar43 [32];
  undefined1 auVar50 [64];
  
  uVar35 = (ulong)len;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = seed + uVar35;
  uVar28 = SUB168(auVar41 * ZEXT816(0xc42b5e2e6480b23b),8) +
           SUB168(auVar41 * ZEXT816(0xc42b5e2e6480b23b),0);
  if (0x20 < (uint)len) {
    do {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)((long)key + 0x10);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)key + 0x18);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *key;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)((long)key + 8);
      uVar35 = uVar35 - 0x20;
      key = (void *)((long)key + 0x20);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = SUB168(ZEXT816(0x32b9b9b97a27ac7d) * auVar19,8);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = SUB168(ZEXT816(0x9ebdcae10d981691) * auVar38,8);
      auVar41 = vpunpcklqdq_avx(auVar55,auVar53);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = SUB168(ZEXT816(0x4b04e0e61401255f) * auVar18,8);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = SUB168(ZEXT816(0x29b5584d83d35bbd) * auVar17,8);
      auVar42 = vpunpcklqdq_avx(auVar57,auVar56);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = SUB168(ZEXT816(0x32b9b9b97a27ac7d) * auVar19,0);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = SUB168(ZEXT816(0x9ebdcae10d981691) * auVar38,0);
      auVar38 = vpunpcklqdq_avx(auVar61,auVar58);
      auVar41 = vpaddq_avx(auVar41,auVar38);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = SUB168(ZEXT816(0x4b04e0e61401255f) * auVar18,0);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = SUB168(ZEXT816(0x29b5584d83d35bbd) * auVar17,0);
      auVar38 = vpunpcklqdq_avx(auVar62,auVar59);
      auVar42 = vpaddq_avx(auVar42,auVar38);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar28;
      auVar38 = vpternlogq_avx512vl(auVar42,auVar41,auVar52,0x96);
      auVar41 = vpshufd_avx(auVar38,0xee);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = SUB168(auVar38 ^ auVar41,0);
      uVar28 = SUB168(auVar42 * ZEXT816(0x7b51ec3d22f7096f),8) +
               SUB168(auVar42 * ZEXT816(0x7b51ec3d22f7096f),0);
    } while (0x20 < uVar35);
  }
  if (7 < uVar35) {
    auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar54 = ZEXT864(uVar28);
    puVar37 = _mum_primes;
    uVar28 = 0;
    auVar48 = vpbroadcastq_avx512f();
    do {
      auVar49 = vpbroadcastq_avx512f();
      auVar49 = vporq_avx512f(auVar49,auVar47);
      uVar5 = vpcmpuq_avx512f(auVar49,auVar48,2);
      auVar49 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)key + uVar28 * 8));
      bVar3 = (byte)uVar5;
      uVar31 = (ulong)(bVar3 & 1) * auVar49._0_8_;
      auVar39._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar49._8_8_;
      auVar39._0_8_ = uVar31;
      uVar30 = (ulong)((byte)(uVar5 >> 2) & 1) * auVar49._16_8_;
      auVar46._16_8_ = uVar30;
      auVar46._0_16_ = auVar39;
      auVar46._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar49._24_8_;
      auVar51._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar49._32_8_;
      auVar51._0_32_ = auVar46;
      auVar51._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar49._40_8_;
      auVar51._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar49._48_8_;
      auVar51._56_8_ = (uVar5 >> 7) * auVar49._56_8_;
      auVar49 = vmovdqu64_avx512f(*(undefined1 (*) [64])puVar37);
      uVar1 = (ulong)(bVar3 & 1) * auVar49._0_8_;
      auVar40._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar49._8_8_;
      auVar40._0_8_ = uVar1;
      uVar2 = (ulong)((byte)(uVar5 >> 2) & 1) * auVar49._16_8_;
      auVar43._16_8_ = uVar2;
      auVar43._0_16_ = auVar40;
      auVar43._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar49._24_8_;
      auVar50._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar49._32_8_;
      auVar50._0_32_ = auVar43;
      auVar50._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar49._40_8_;
      auVar50._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar49._48_8_;
      auVar50._56_8_ = (uVar5 >> 7) * auVar49._56_8_;
      uVar28 = uVar28 + 8;
      puVar37 = (uint64_t *)((long)puVar37 + 0x40);
      auVar44 = vextracti64x4_avx512f(auVar51,1);
      uVar32 = vpextrq_avx(auVar39,1);
      uVar34 = vpextrq_avx(auVar40,1);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar1;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar31;
      uVar31 = vpextrq_avx(auVar44._0_16_,1);
      auVar45 = vextracti64x4_avx512f(auVar50,1);
      uVar36 = vpextrq_avx(auVar46._16_16_,1);
      uVar29 = vpextrq_avx(auVar45._0_16_,1);
      uVar1 = vpextrq_avx(auVar44._16_16_,1);
      uVar33 = vpextrq_avx(auVar43._16_16_,1);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar34;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar32;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar2;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar30;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar33;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar36;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = auVar45._0_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar44._0_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar29;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar31;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auVar45._16_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = auVar44._16_8_;
      uVar30 = vpextrq_avx(auVar45._16_16_,1);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar30;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar1;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = SUB168(auVar13 * auVar27,8);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = SUB168(auVar12 * auVar26,8);
      auVar41 = vpunpcklqdq_avx(auVar63,auVar60);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = SUB168(auVar11 * auVar25,8);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = SUB168(auVar10 * auVar24,8);
      auVar42 = vpunpcklqdq_avx(auVar65,auVar64);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = SUB168(auVar9 * auVar23,8);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = SUB168(auVar8 * auVar22,8);
      auVar38 = vpunpcklqdq_avx(auVar67,auVar66);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = SUB168(auVar7 * auVar21,8);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = SUB168(auVar6 * auVar20,8);
      auVar17 = vpunpcklqdq_avx(auVar69,auVar68);
      auVar44._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar42;
      auVar44._16_16_ = ZEXT116(1) * auVar41;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = SUB168(auVar13 * auVar27,0);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = SUB168(auVar12 * auVar26,0);
      auVar41 = vpunpcklqdq_avx(auVar71,auVar70);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = SUB168(auVar11 * auVar25,0);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = SUB168(auVar10 * auVar24,0);
      auVar42 = vpunpcklqdq_avx(auVar73,auVar72);
      auVar49 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar38,
                                               ZEXT116(0) * auVar38 + ZEXT116(1) * auVar17)),auVar44
                           ,1);
      auVar45._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar42;
      auVar45._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar41;
      auVar51 = vmovdqa64_avx512f(auVar54);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = SUB168(auVar9 * auVar23,0);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = SUB168(auVar8 * auVar22,0);
      auVar41 = vpunpcklqdq_avx512vl(auVar75,auVar74);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = SUB168(auVar7 * auVar21,0);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = SUB168(auVar6 * auVar20,0);
      auVar42 = vpunpcklqdq_avx512vl(auVar77,auVar76);
      auVar54 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar41,
                                               ZEXT116(0) * auVar41 + ZEXT116(1) * auVar42)),auVar45
                           ,1);
      auVar54 = vpaddq_avx512f(auVar49,auVar54);
      auVar54 = vpxorq_avx512f(auVar54,auVar51);
    } while (((uVar35 >> 3) + 7 & 0xfffffffffffffff8) != uVar28);
    auVar47 = vmovdqa64_avx512f(auVar54);
    auVar48._0_8_ = (ulong)(bVar3 & 1) * auVar47._0_8_ | (ulong)!(bool)(bVar3 & 1) * auVar51._0_8_;
    bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar48._8_8_ = (ulong)bVar4 * auVar47._8_8_ | (ulong)!bVar4 * auVar51._8_8_;
    bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar48._16_8_ = (ulong)bVar4 * auVar47._16_8_ | (ulong)!bVar4 * auVar51._16_8_;
    bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar48._24_8_ = (ulong)bVar4 * auVar47._24_8_ | (ulong)!bVar4 * auVar51._24_8_;
    bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar48._32_8_ = (ulong)bVar4 * auVar47._32_8_ | (ulong)!bVar4 * auVar51._32_8_;
    bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar48._40_8_ = (ulong)bVar4 * auVar47._40_8_ | (ulong)!bVar4 * auVar51._40_8_;
    bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar48._48_8_ = (ulong)bVar4 * auVar47._48_8_ | (ulong)!bVar4 * auVar51._48_8_;
    auVar48._56_8_ = (uVar5 >> 7) * auVar47._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar51._56_8_;
    auVar46 = vextracti64x4_avx512f(auVar48,1);
    auVar47 = vpxorq_avx512f(auVar48,ZEXT3264(auVar46));
    auVar42 = auVar47._0_16_ ^ auVar47._16_16_;
    auVar41 = vpshufd_avx(auVar42,0xee);
    uVar28 = auVar42._0_8_ ^ auVar41._0_8_;
  }
  uVar30 = (ulong)((uint)uVar35 & 0x38);
  switch((uint)uVar35 & 7) {
  case 0:
    goto switchD_001749be_caseD_0;
  case 1:
    uVar31 = (ulong)*(byte *)((long)key + uVar30);
    break;
  case 2:
    uVar31 = (ulong)*(ushort *)((long)key + uVar30);
    break;
  case 3:
    uVar35 = (ulong)*(ushort *)((long)key + uVar30);
    uVar31 = (ulong)*(byte *)((long)key + uVar30 + 2) << 0x10;
    goto LAB_00174a39;
  case 4:
    uVar31 = (ulong)*(uint *)((long)key + uVar30);
    break;
  case 5:
    uVar35 = (ulong)*(uint *)((long)key + uVar30);
    uVar31 = (ulong)*(byte *)((long)key + uVar30 + 4) << 0x20;
    goto LAB_00174a39;
  case 6:
    uVar31 = (ulong)CONCAT15(*(undefined1 *)((long)key + uVar30 + 5),
                             CONCAT14(*(undefined1 *)((long)key + uVar30 + 4),
                                      *(undefined4 *)((long)key + uVar30)));
    break;
  case 7:
    uVar31 = (ulong)*(byte *)((long)key + uVar30 + 6) << 0x30;
    uVar35 = (ulong)CONCAT15(*(undefined1 *)((long)key + uVar30 + 5),
                             CONCAT14(*(undefined1 *)((long)key + uVar30 + 4),
                                      *(undefined4 *)((long)key + uVar30)));
LAB_00174a39:
    uVar31 = uVar31 | uVar35;
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar31;
  uVar28 = uVar28 ^ SUB168(auVar14 * ZEXT816(0xaf47d47c99b1461b),8) +
                    SUB168(auVar14 * ZEXT816(0xaf47d47c99b1461b),0);
switchD_001749be_caseD_0:
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar28;
  uVar28 = SUB168(auVar15 * ZEXT816(0xa9a7ae7ceff79f3f),8) +
           SUB168(auVar15 * ZEXT816(0xa9a7ae7ceff79f3f),0) ^ uVar28;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar28;
  *(ulong *)out =
       SUB168(auVar16 * ZEXT816(0xaf47d47c99b1461b),8) +
       SUB168(auVar16 * ZEXT816(0xaf47d47c99b1461b),0) ^ uVar28;
  return;
}

Assistant:

void mum_hash_test(const void *key, int len, uint32_t seed, void *out) {
  *(uint64_t *)out = mum_hash(key, len, seed);
}